

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

float nifti_mat33_determ(mat33 R)

{
  return (R.m[0][1] * R.m[2][0] * R.m[1][2] +
         R.m[1][0] * R.m[2][1] * R.m[0][2] +
         ((R.m[0][0] * R.m[1][1] * R.m[2][2] - R.m[0][0] * R.m[2][1] * R.m[1][2]) -
         R.m[0][1] * R.m[1][0] * R.m[2][2])) - R.m[1][1] * R.m[2][0] * R.m[0][2];
}

Assistant:

float nifti_mat33_determ( mat33 R )   /* determinant of 3x3 matrix */
{
   double r11,r12,r13,r21,r22,r23,r31,r32,r33 ;
                                                       /*  INPUT MATRIX:  */
   r11 = R.m[0][0]; r12 = R.m[0][1]; r13 = R.m[0][2];  /* [ r11 r12 r13 ] */
   r21 = R.m[1][0]; r22 = R.m[1][1]; r23 = R.m[1][2];  /* [ r21 r22 r23 ] */
   r31 = R.m[2][0]; r32 = R.m[2][1]; r33 = R.m[2][2];  /* [ r31 r32 r33 ] */

   return (float)(r11*r22*r33-r11*r32*r23-r21*r12*r33
         +r21*r32*r13+r31*r12*r23-r31*r22*r13) ;
}